

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.h
# Opt level: O2

void rapidjson::internal::Grisu2(double value,char *buffer,int *length,int *K)

{
  int *rhs;
  uint uVar1;
  DiyFp DVar2;
  DiyFp DVar3;
  undefined1 local_a8 [8];
  DiyFp v;
  DiyFp w_m;
  DiyFp w_p;
  DiyFp local_68;
  DiyFp local_58;
  int *local_48;
  char *local_40;
  int *local_38;
  
  uVar1 = (uint)((ulong)value >> 0x34) & 0x7ff;
  local_a8 = (undefined1  [8])(((ulong)value & 0xfffffffffffff) + 0x10000000000000);
  if (uVar1 == 0) {
    local_a8 = (undefined1  [8])((ulong)value & 0xfffffffffffff);
  }
  v.f._0_4_ = -0x432;
  if (uVar1 != 0) {
    v.f._0_4_ = uVar1 - 0x433;
  }
  v.e = 0;
  v._12_4_ = 0;
  w_m.f._0_4_ = 0;
  w_m.e = 0;
  w_m._12_4_ = 0;
  w_p.f._0_4_ = 0;
  local_48 = length;
  local_40 = buffer;
  local_38 = K;
  DiyFp::NormalizedBoundaries((DiyFp *)local_a8,(DiyFp *)&v.e,(DiyFp *)&w_m.e);
  DVar2 = GetCachedPower((int)w_p.f,K);
  w_p._8_8_ = DVar2.f;
  rhs = &w_p.e;
  DVar2 = DiyFp::Normalize((DiyFp *)local_a8);
  local_58.f = DVar2.f;
  local_58.e = DVar2.e;
  DVar2 = DiyFp::operator*(&local_58,(DiyFp *)rhs);
  local_68.f = DVar2.f;
  local_68.e = DVar2.e;
  DVar2 = DiyFp::operator*((DiyFp *)&w_m.e,(DiyFp *)rhs);
  local_58.e = DVar2.e;
  DVar3 = DiyFp::operator*((DiyFp *)&v.e,(DiyFp *)rhs);
  local_58.f = DVar2.f - 1;
  DigitGen(&local_68,&local_58,(~DVar3.f + DVar2.f) - 1,local_40,local_48,local_38);
  return;
}

Assistant:

inline void Grisu2(double value, char* buffer, int* length, int* K) {
    const DiyFp v(value);
    DiyFp w_m, w_p;
    v.NormalizedBoundaries(&w_m, &w_p);

    const DiyFp c_mk = GetCachedPower(w_p.e, K);
    const DiyFp W = v.Normalize() * c_mk;
    DiyFp Wp = w_p * c_mk;
    DiyFp Wm = w_m * c_mk;
    Wm.f++;
    Wp.f--;
    DigitGen(W, Wp, Wp.f - Wm.f, buffer, length, K);
}